

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_all_bvec4(ShaderEvalContext *c)

{
  ulong uVar1;
  int i;
  long lVar2;
  ulong uVar3;
  float fVar4;
  Vector<bool,_4> res;
  undefined8 local_28;
  float local_20;
  float local_1c;
  float local_18 [6];
  
  local_28 = *(undefined8 *)(c->in[0].m_data + 1);
  local_20 = c->in[0].m_data[3];
  local_1c = c->in[0].m_data[0];
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  local_18[2] = 0.0;
  local_18[3] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  res.m_data[3] = false;
  lVar2 = 0;
  do {
    fVar4 = *(float *)((long)&local_28 + lVar2 * 4);
    res.m_data[lVar2] = local_18[lVar2] <= fVar4 && fVar4 != local_18[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (res.m_data[0] != false) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 3) break;
      uVar1 = uVar3 + 1;
    } while (res.m_data[uVar3 + 1] != false);
    if (2 < uVar3) {
      fVar4 = 1.0;
      goto LAB_004c30aa;
    }
  }
  fVar4 = 0.0;
LAB_004c30aa:
  (c->color).m_data[0] = fVar4;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }